

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTestInstance::verifyTestResult
          (TestStatus *__return_storage_ptr__,GraphicsCacheTestInstance *this)

{
  undefined8 queue_00;
  deUint32 queueFamilyIndex_00;
  DeviceInterface *vk_00;
  VkDevice device;
  VkQueue queue_01;
  Allocator *pAVar1;
  Handle<(vk::HandleType)9> *pHVar2;
  TestContext *this_00;
  TestLog *log;
  TextureLevel *pTVar3;
  allocator<char> local_129;
  string local_128;
  undefined4 local_108;
  allocator<char> local_101;
  string local_100;
  Vector<unsigned_int,_4> local_e0;
  ConstPixelBufferAccess local_d0;
  ConstPixelBufferAccess local_a8;
  undefined1 local_79;
  VkImage VStack_78;
  bool compareOk;
  undefined1 local_60 [8];
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> resultCache;
  undefined1 local_48 [8];
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> resultNoCache;
  VkQueue queue;
  deUint32 queueFamilyIndex;
  VkDevice vkDevice;
  DeviceInterface *vk;
  GraphicsCacheTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  queueFamilyIndex_00 =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_CacheTestInstance).super_TestInstance.m_context);
  queue_01 = Context::getUniversalQueue
                       ((this->super_CacheTestInstance).super_TestInstance.m_context);
  resultNoCache.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
  _8_8_ = queue_01;
  pAVar1 = Context::getDefaultAllocator
                     ((this->super_CacheTestInstance).super_TestInstance.m_context);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  resultCache.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
  _8_8_ = pHVar2->m_internal;
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_48
                      ,vk_00,device,queue_01,queueFamilyIndex_00,pAVar1,
                      (VkImage)resultCache.
                               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                               .m_data._8_8_,this->m_colorFormat,&this->m_renderSize);
  queue_00 = resultNoCache.
             super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
             _8_8_;
  pAVar1 = Context::getDefaultAllocator
                     ((this->super_CacheTestInstance).super_TestInstance.m_context);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  VStack_78.m_internal = pHVar2->m_internal;
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_60
                      ,vk_00,device,(VkQueue)queue_00,queueFamilyIndex_00,pAVar1,VStack_78,
                      this->m_colorFormat,&this->m_renderSize);
  this_00 = Context::getTestContext((this->super_CacheTestInstance).super_TestInstance.m_context);
  log = tcu::TestContext::getLog(this_00);
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_48);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_a8,pTVar3);
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_60);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_d0,pTVar3);
  tcu::Vector<unsigned_int,_4>::Vector(&local_e0,1,1,1,1);
  local_79 = tcu::intThresholdCompare
                       (log,"IntImageCompare","Image comparison",&local_a8,&local_d0,&local_e0,
                        COMPARE_LOG_RESULT);
  if ((bool)local_79) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"Render images w/o cached pipeline match.",&local_101);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"Render Images mismatch.",&local_129);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
  }
  local_108 = 1;
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_60);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GraphicsCacheTestInstance::verifyTestResult (void)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();
	const deUint32          queueFamilyIndex = m_context.getUniversalQueueFamilyIndex();

	const VkQueue                   queue               = m_context.getUniversalQueue();
	de::MovePtr<tcu::TextureLevel>  resultNoCache       = readColorAttachment(vk,
																			  vkDevice,
																			  queue,
																			  queueFamilyIndex,
																			  m_context.getDefaultAllocator(),
																			  *m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE],
																			  m_colorFormat,
																			  m_renderSize);
	de::MovePtr<tcu::TextureLevel>  resultCache         = readColorAttachment(vk,
																			  vkDevice,
																			  queue,
																			  queueFamilyIndex,
																			  m_context.getDefaultAllocator(),
																			  *m_colorImage[PIPELINE_CACHE_NDX_CACHED],
																			  m_colorFormat,
																			  m_renderSize);

	bool compareOk = tcu::intThresholdCompare(m_context.getTestContext().getLog(),
											  "IntImageCompare",
											  "Image comparison",
											  resultNoCache->getAccess(),
											  resultCache->getAccess(),
											  tcu::UVec4(1, 1, 1, 1),
											  tcu::COMPARE_LOG_RESULT);

	if (compareOk)
		return tcu::TestStatus::pass("Render images w/o cached pipeline match.");
	else
		return tcu::TestStatus::fail("Render Images mismatch.");
}